

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_can_refuel(player *p,_Bool show_msg)

{
  _Bool _Var1;
  object *poVar2;
  object *obj;
  _Bool show_msg_local;
  player *p_local;
  
  poVar2 = equipped_item_by_slot_name(p,"light");
  if ((poVar2 == (object *)0x0) ||
     (_Var1 = flag_has_dbg(poVar2->flags,6,0x18,"obj->flags","OF_TAKES_FUEL"), !_Var1)) {
    if (show_msg) {
      msg("Your light cannot be refuelled.");
    }
    p_local._7_1_ = false;
  }
  else {
    p_local._7_1_ = true;
  }
  return p_local._7_1_;
}

Assistant:

bool player_can_refuel(struct player *p, bool show_msg)
{
	struct object *obj = equipped_item_by_slot_name(p, "light");

	if (obj && of_has(obj->flags, OF_TAKES_FUEL)) {
		return true;
	}

	if (show_msg) {
		msg("Your light cannot be refuelled.");
	}

	return false;
}